

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::
addEvent<std::multiset<int,std::less<int>,std::allocator<int>>&,std::multimap<int,char,std::less<int>,std::allocator<std::pair<int_const,char>>>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          multiset<int,_std::less<int>,_std::allocator<int>_> *args,
          multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_> *args_1)

{
  _Rb_tree_header *p_Var1;
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar2;
  undefined4 uVar3;
  char *pcVar4;
  Queue *pQVar5;
  _Rb_tree_node_base *p_Var6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_> *__range3_1;
  multiset<int,_std::less<int>,_std::allocator<int>_> *__range3;
  
  p_Var6 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar9 = 4;
  lVar8 = 4;
  while ((_Rb_tree_header *)p_Var6 != &(args->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    lVar8 = lVar8 + 4;
  }
  p_Var6 = (args_1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(args_1->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    lVar9 = 4;
    do {
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      lVar9 = lVar9 + 5;
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  lVar9 = lVar9 + lVar8 + 0x10;
  minQueueCapacity = lVar9 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar7 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar7 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar7 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar7 < minQueueCapacity)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)lVar9;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 4;
  *(uint64_t *)(pcVar4 + 4) = eventSourceId;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  *(uint64_t *)(pcVar4 + 8) = clock;
  ppcVar2 = &(this->_qw)._writePos;
  *ppcVar2 = *ppcVar2 + 8;
  mserialize::detail::
  BuiltinSerializer<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_void>::
  serialize<binlog::detail::QueueWriter>(args,this_00);
  uVar3 = (undefined4)(args_1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)(this->_qw)._writePos = uVar3;
  ppcVar2 = &(this->_qw)._writePos;
  *ppcVar2 = *ppcVar2 + 4;
  mserialize::detail::
  BuiltinSerializer<std::multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>,_void>
  ::serialize_elems<binlog::detail::QueueWriter>(args_1,uVar3,this_00);
  pQVar5 = (this->_qw)._queue;
  (pQVar5->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar5->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}